

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_popTest_Test::TestBody(OpenDDLParserTest_popTest_Test *this)

{
  DDLNode *pDVar1;
  char *pcVar2;
  AssertHelper AStack_d8;
  AssertionResult gtest_ar;
  string local_b0;
  DDLNode *node3;
  DDLNode *node2;
  DDLNode *node1;
  DDLNode *current;
  allocator<char> local_69;
  OpenDDLParser theParser;
  
  OpenDDLParser::OpenDDLParser(&theParser);
  current = OpenDDLParser::top(&theParser);
  testing::internal::EqHelper<true>::Compare<ODDLParser::DDLNode>
            ((EqHelper<true> *)&gtest_ar,"nullptr","current",(Secret *)0x0,current);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x306,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node1,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"test1",(allocator<char> *)&node2);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"",(allocator<char> *)&node3);
  pDVar1 = DDLNode::create((string *)&gtest_ar,&local_b0,(DDLNode *)0x0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  node1 = pDVar1;
  OpenDDLParser::pushNode(&theParser,pDVar1);
  current = OpenDDLParser::top(&theParser);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&gtest_ar,"node1","current",&node1,&current);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x30b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node2,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"test2",(allocator<char> *)&node3);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"",(allocator<char> *)&AStack_d8);
  pDVar1 = DDLNode::create((string *)&gtest_ar,&local_b0,(DDLNode *)0x0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  node2 = pDVar1;
  OpenDDLParser::pushNode(&theParser,pDVar1);
  current = OpenDDLParser::top(&theParser);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&gtest_ar,"node2","current",&node2,&current);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x310,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node3,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"test3",(allocator<char> *)&AStack_d8);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_69);
  pDVar1 = DDLNode::create((string *)&gtest_ar,&local_b0,(DDLNode *)0x0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  node3 = pDVar1;
  OpenDDLParser::pushNode(&theParser,pDVar1);
  current = OpenDDLParser::top(&theParser);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&gtest_ar,"node3","current",&node3,&current);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x315,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  current = OpenDDLParser::popNode(&theParser);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&gtest_ar,"node3","current",&node3,&current);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x318,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  current = OpenDDLParser::popNode(&theParser);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&gtest_ar,"node2","current",&node2,&current);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x31a,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  current = OpenDDLParser::popNode(&theParser);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&gtest_ar,"node1","current",&node1,&current);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x31c,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  current = OpenDDLParser::top(&theParser);
  testing::internal::EqHelper<true>::Compare<ODDLParser::DDLNode>
            ((EqHelper<true> *)&gtest_ar,"nullptr","current",(Secret *)0x0,current);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,799,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pDVar1 = node1;
  if (node1 != (DDLNode *)0x0) {
    DDLNode::~DDLNode(node1);
  }
  operator_delete(pDVar1,0x88);
  pDVar1 = node2;
  if (node2 != (DDLNode *)0x0) {
    DDLNode::~DDLNode(node2);
  }
  operator_delete(pDVar1,0x88);
  pDVar1 = node3;
  if (node3 != (DDLNode *)0x0) {
    DDLNode::~DDLNode(node3);
  }
  operator_delete(pDVar1,0x88);
  OpenDDLParser::~OpenDDLParser(&theParser);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, popTest) {
    OpenDDLParser theParser;

    DDLNode *current = theParser.top();
    EXPECT_EQ(nullptr, current);

    DDLNode *node1 = DDLNode::create("test1", "", nullptr);
    theParser.pushNode(node1);
    current = theParser.top();
    EXPECT_EQ(node1, current);

    DDLNode *node2 = DDLNode::create("test2", "", nullptr);
    theParser.pushNode(node2);
    current = theParser.top();
    EXPECT_EQ(node2, current);

    DDLNode *node3 = DDLNode::create("test3", "", nullptr);
    theParser.pushNode(node3);
    current = theParser.top();
    EXPECT_EQ(node3, current);

    current = theParser.popNode();
    EXPECT_EQ(node3, current);
    current = theParser.popNode();
    EXPECT_EQ(node2, current);
    current = theParser.popNode();
    EXPECT_EQ(node1, current);

    current = theParser.top();
    EXPECT_EQ(nullptr, current);
    delete node1;
    delete node2;
    delete node3;
}